

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O3

void __thiscall
QKmsDevice::enumerateProperties
          (QKmsDevice *this,drmModeObjectPropertiesPtr objProps,PropCallback callback)

{
  uint uVar1;
  uint64_t uVar2;
  uint *puVar3;
  uint uVar4;
  bool bVar5;
  long in_RDX;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long in_FS_OFFSET;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined8 uStack_54;
  undefined4 local_4c;
  char *local_48;
  uint64_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (objProps->count_props != 0) {
    uVar8 = 0;
    do {
      puVar3 = (uint *)drmModeGetProperty(this->m_dri_fd,objProps->props[uVar8]);
      if (puVar3 != (uint *)0x0) {
        uVar2 = objProps->prop_values[uVar8];
        qLcKmsDebug();
        if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
        {
          local_60 = 2;
          uStack_5c = 0;
          uStack_58 = 0;
          uStack_54 = 0;
          local_4c = 0;
          local_48 = qLcKmsDebug::category.name;
          QMessageLogger::debug
                    ((char *)&local_60,"  property %d: id = %u name = \'%s\'",uVar8 & 0xffffffff,
                     (ulong)*puVar3,puVar3 + 2);
        }
        uVar1 = puVar3[1];
        uVar4 = uVar1 & 0xffc0;
        bVar5 = (uVar1 & 0xffc0) == 0x80;
        if (uVar4 == 0) {
          bVar5 = (char)uVar1 < '\0';
        }
        if (bVar5) {
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_60 = 2;
            uStack_5c = 0;
            uStack_58 = 0;
            uStack_54 = 0;
            local_4c = 0;
            local_48 = qLcKmsDebug::category.name;
            QMessageLogger::debug
                      ((char *)&local_60,
                       "  type is SIGNED_RANGE, value is %lld, possible values are:",uVar2);
          }
          if (0 < (int)puVar3[10]) {
            lVar9 = 0;
            do {
              qLcKmsDebug();
              if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                  != 0) {
                local_60 = 2;
                uStack_5c = 0;
                uStack_58 = 0;
                uStack_54 = 0;
                local_4c = 0;
                local_48 = qLcKmsDebug::category.name;
                QMessageLogger::debug
                          ((char *)&local_60,"    %lld",
                           *(undefined8 *)(*(long *)(puVar3 + 0xc) + lVar9 * 8));
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < (int)puVar3[10]);
          }
        }
        else if ((uVar1 & 0xffc2) == 2) {
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_60 = 2;
            uStack_5c = 0;
            uStack_58 = 0;
            uStack_54 = 0;
            local_4c = 0;
            local_48 = qLcKmsDebug::category.name;
            QMessageLogger::debug
                      ((char *)&local_60,"  type is RANGE, value is %llu, possible values are:",
                       uVar2);
          }
          if (0 < (int)puVar3[10]) {
            lVar9 = 0;
            do {
              qLcKmsDebug();
              if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                  != 0) {
                local_60 = 2;
                uStack_5c = 0;
                uStack_58 = 0;
                uStack_54 = 0;
                local_4c = 0;
                local_48 = qLcKmsDebug::category.name;
                QMessageLogger::debug
                          ((char *)&local_60,"    %llu",
                           *(undefined8 *)(*(long *)(puVar3 + 0xc) + lVar9 * 8));
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < (int)puVar3[10]);
          }
        }
        else if ((uVar1 & 0xffc8) == 8) {
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_60 = 2;
            uStack_5c = 0;
            uStack_58 = 0;
            uStack_54 = 0;
            local_4c = 0;
            local_48 = qLcKmsDebug::category.name;
            QMessageLogger::debug
                      ((char *)&local_60,"  type is ENUM, value is %llu, possible values are:",uVar2
                      );
          }
          if (0 < (int)puVar3[0xe]) {
            lVar9 = 8;
            uVar6 = 0;
            do {
              qLcKmsDebug();
              if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                  != 0) {
                local_60 = 2;
                uStack_5c = 0;
                uStack_58 = 0;
                uStack_54 = 0;
                local_4c = 0;
                local_48 = qLcKmsDebug::category.name;
                QMessageLogger::debug
                          ((char *)&local_60,"    enum %d: %s - %llu",uVar6 & 0xffffffff,
                           *(long *)(puVar3 + 0x10) + lVar9,
                           *(undefined8 *)(*(long *)(puVar3 + 0x10) + -8 + lVar9));
              }
              uVar6 = uVar6 + 1;
              lVar9 = lVar9 + 0x28;
            } while ((long)uVar6 < (long)(int)puVar3[0xe]);
          }
        }
        else if ((uVar1 & 0xffe0) == 0x20) {
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_60 = 2;
            uStack_5c = 0;
            uStack_58 = 0;
            uStack_54 = 0;
            local_4c = 0;
            local_48 = qLcKmsDebug::category.name;
            QMessageLogger::debug
                      ((char *)&local_60,"  type is BITMASK, value is %llu, possible bits are:",
                       uVar2);
          }
          if (0 < (int)puVar3[0xe]) {
            lVar9 = 8;
            uVar6 = 0;
            do {
              qLcKmsDebug();
              if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                  != 0) {
                local_60 = 2;
                uStack_5c = 0;
                uStack_58 = 0;
                uStack_54 = 0;
                local_4c = 0;
                local_48 = qLcKmsDebug::category.name;
                QMessageLogger::debug
                          ((char *)&local_60,"    bitmask %d: %s - %u",uVar6 & 0xffffffff,
                           *(long *)(puVar3 + 0x10) + lVar9,
                           (ulong)(uint)(1 << (*(byte *)(*(long *)(puVar3 + 0x10) + -8 + lVar9) &
                                              0x1f)));
              }
              uVar6 = uVar6 + 1;
              lVar9 = lVar9 + 0x28;
            } while ((long)uVar6 < (long)(int)puVar3[0xe]);
          }
        }
        else if ((uVar1 & 0xffd0) == 0x10) {
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            pcVar7 = "  type is BLOB";
LAB_001127c8:
            local_4c = 0;
            uStack_54 = 0;
            uStack_58 = 0;
            uStack_5c = 0;
            local_60 = 2;
            local_48 = qLcKmsDebug::category.name;
            QMessageLogger::debug((char *)&local_60,pcVar7);
          }
        }
        else {
          bVar5 = uVar4 == 0x40;
          if (uVar4 == 0) {
            bVar5 = SUB41((uVar1 & 0x40) >> 6,0);
          }
          if ((bVar5 == true) &&
             (qLcKmsDebug(),
             ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             )) {
            pcVar7 = "  type is OBJECT";
            goto LAB_001127c8;
          }
        }
        local_60 = SUB84(puVar3,0);
        uStack_5c = (undefined4)((ulong)puVar3 >> 0x20);
        local_40 = uVar2;
        if (*(long *)(in_RDX + 0x10) == 0) {
          std::__throw_bad_function_call();
          goto LAB_00112835;
        }
        (**(code **)(in_RDX + 0x18))(in_RDX,&local_60,&local_40);
        drmModeFreeProperty(puVar3);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < objProps->count_props);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00112835:
  __stack_chk_fail();
}

Assistant:

void QKmsDevice::enumerateProperties(drmModeObjectPropertiesPtr objProps, PropCallback callback)
{
    for (uint32_t propIdx = 0; propIdx < objProps->count_props; ++propIdx) {
        drmModePropertyPtr prop = drmModeGetProperty(m_dri_fd, objProps->props[propIdx]);
        if (!prop)
            continue;

        const quint64 value = objProps->prop_values[propIdx];
        qCDebug(qLcKmsDebug, "  property %d: id = %u name = '%s'", propIdx, prop->prop_id, prop->name);

        if (propTypeIs(prop, DRM_MODE_PROP_SIGNED_RANGE)) {
            qCDebug(qLcKmsDebug, "  type is SIGNED_RANGE, value is %lld, possible values are:", qint64(value));
            for (int i = 0; i < prop->count_values; ++i)
                qCDebug(qLcKmsDebug, "    %lld", qint64(prop->values[i]));
        } else if (propTypeIs(prop, DRM_MODE_PROP_RANGE)) {
            qCDebug(qLcKmsDebug, "  type is RANGE, value is %llu, possible values are:", value);
            for (int i = 0; i < prop->count_values; ++i)
                qCDebug(qLcKmsDebug, "    %llu", quint64(prop->values[i]));
        } else if (propTypeIs(prop, DRM_MODE_PROP_ENUM)) {
            qCDebug(qLcKmsDebug, "  type is ENUM, value is %llu, possible values are:", value);
            for (int i = 0; i < prop->count_enums; ++i)
                qCDebug(qLcKmsDebug, "    enum %d: %s - %llu", i, prop->enums[i].name, quint64(prop->enums[i].value));
        } else if (propTypeIs(prop, DRM_MODE_PROP_BITMASK)) {
            qCDebug(qLcKmsDebug, "  type is BITMASK, value is %llu, possible bits are:", value);
            for (int i = 0; i < prop->count_enums; ++i)
                qCDebug(qLcKmsDebug, "    bitmask %d: %s - %u", i, prop->enums[i].name, 1 << prop->enums[i].value);
        } else if (propTypeIs(prop, DRM_MODE_PROP_BLOB)) {
            qCDebug(qLcKmsDebug, "  type is BLOB");
        } else if (propTypeIs(prop, DRM_MODE_PROP_OBJECT)) {
            qCDebug(qLcKmsDebug, "  type is OBJECT");
        }

        callback(prop, value);

        drmModeFreeProperty(prop);
    }
}